

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::anon_unknown_0::ReconstructMaterialBindingProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,MaterialBinding *mb,string *err)

{
  _Base_ptr p_Var1;
  string *psVar2;
  undefined8 uVar3;
  int iVar4;
  long *plVar5;
  const_iterator cVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  uint *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *pcVar14;
  undefined **in;
  char *pcVar15;
  MaterialBinding *this;
  long lVar16;
  void *pvVar17;
  _Base_ptr p_Var18;
  bool bVar19;
  string collection_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  ostringstream ss_e;
  undefined1 local_270 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string *local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_228;
  _Base_ptr local_220;
  _Base_ptr local_218;
  MaterialBinding *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  _Base_ptr local_1c8;
  MaterialBinding *local_1c0;
  MaterialBinding *local_1b8;
  undefined1 local_1b0 [112];
  ios_base local_140 [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  *local_38;
  
  if (mb == (MaterialBinding *)0x0) {
LAB_00222ccc:
    bVar19 = false;
  }
  else {
    p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var18 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar19 = true;
    if (p_Var12 != p_Var18) {
      local_218 = &(table->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_1b8 = (MaterialBinding *)&mb->materialBindingPreview;
      args = (uint *)&mb->materialBindingFull;
      local_38 = &mb->_materialBindingCollectionMap;
      local_230 = err;
      local_228 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)table;
      local_220 = p_Var18;
      local_210 = mb;
      local_1c0 = (MaterialBinding *)args;
      do {
        p_Var1 = p_Var12 + 1;
        iVar4 = ::std::__cxx11::string::compare((char *)p_Var1);
        if (iVar4 == 0) {
          local_1b0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b0 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"material:binding","");
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_228,(key_type *)local_1b0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
          }
          if (cVar6._M_node != local_218) goto LAB_0022297c;
          if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            if (*(uint *)&p_Var12[0x17]._M_left < 4) {
              args = &switchD_002217eb::switchdataD_003dcfb0;
              switch(*(uint *)&p_Var12[0x17]._M_left) {
              default:
                nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                          (&local_210->materialBinding,(Relationship *)&p_Var12[0x17]._M_left);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_228,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var1);
                goto LAB_00221693;
              case 1:
                goto switchD_002217eb_caseD_1;
              case 2:
                if ((long)p_Var12[0x1e]._M_left - (long)p_Var12[0x1e]._M_parent != 0xd0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  pcVar15 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                  pcVar14 = "";
                  goto LAB_00222a47;
                }
switchD_002217eb_caseD_1:
                this = local_210;
              }
LAB_00221e1e:
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        (&this->materialBinding,(Relationship *)&p_Var12[0x17]._M_left);
              goto LAB_00221e23;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar15 = "Internal error. Property `{}` is not a valid Relationship.";
            pcVar14 = "";
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar15 = "Property `{}` must be a Relationship.";
            pcVar14 = "";
          }
LAB_00222a47:
          local_270._0_8_ = local_270 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,pcVar15,pcVar14);
          in = &kMaterialBinding;
LAB_00222b98:
          fmt::format<char_const*>((string *)&local_250,(fmt *)local_270,(string *)in,(char **)args)
          ;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_250._M_allocated_capacity,
                               local_250._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_allocated_capacity != &local_240) {
            operator_delete((void *)local_250._M_allocated_capacity,
                            local_240._M_allocated_capacity + 1);
          }
          psVar2 = local_230;
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
          }
          if (psVar2 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar5 = (long *)::std::__cxx11::string::_M_append
                                       (local_270,(ulong)(psVar2->_M_dataplus)._M_p);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar13) {
              local_240._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_240._8_8_ = plVar5[3];
              local_250._M_allocated_capacity = (size_type)&local_240;
            }
            else {
              local_240._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_250._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar5;
            }
            local_250._8_8_ = plVar5[1];
            *plVar5 = (long)paVar13;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar2,(string *)local_250._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_allocated_capacity != &local_240) {
LAB_00222c87:
              operator_delete((void *)local_250._M_allocated_capacity,
                              local_240._M_allocated_capacity + 1);
            }
LAB_00222c94:
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
LAB_00222c9e:
              operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
            }
          }
LAB_00222cab:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
          ::std::ios_base::~ios_base(local_140);
          goto LAB_00222ccc;
        }
LAB_00221693:
        iVar4 = ::std::__cxx11::string::compare((char *)p_Var1);
        if (iVar4 == 0) {
          local_1b0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b0 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"material:binding:preview","");
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_228,(key_type *)local_1b0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
          }
          if (cVar6._M_node != local_218) goto LAB_0022297c;
          if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            if (*(uint *)&p_Var12[0x17]._M_left < 4) {
              args = &switchD_002218ab::switchdataD_003dcfc0;
              switch(*(uint *)&p_Var12[0x17]._M_left) {
              default:
                nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                          (&local_1b8->materialBinding,(Relationship *)&p_Var12[0x17]._M_left);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_228,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var1);
                goto LAB_002216a6;
              case 1:
                goto switchD_002218ab_caseD_1;
              case 2:
                if ((long)p_Var12[0x1e]._M_left - (long)p_Var12[0x1e]._M_parent != 0xd0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3)
                  ;
                  iVar4 = 0x9f1;
LAB_00223447:
                  poVar10 = (ostream *)::std::ostream::operator<<(local_1b0,iVar4);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  pcVar15 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                  pcVar14 = "";
                  goto LAB_00222b89;
                }
switchD_002218ab_caseD_1:
                this = local_1b8;
              }
              goto LAB_00221e1e;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f1);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar15 = "Internal error. Property `{}` is not a valid Relationship.";
            pcVar14 = "";
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            iVar4 = 0x9f1;
LAB_00222b55:
            poVar10 = (ostream *)::std::ostream::operator<<(local_1b0,iVar4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar15 = "Property `{}` must be a Relationship.";
            pcVar14 = "";
          }
LAB_00222b89:
          local_270._0_8_ = local_270 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,pcVar15,pcVar14);
          in = &kMaterialBindingPreview;
          goto LAB_00222b98;
        }
LAB_002216a6:
        iVar4 = ::std::__cxx11::string::compare((char *)p_Var1);
        if (iVar4 == 0) {
          local_1b0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b0 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"material:binding:preview","");
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_228,(key_type *)local_1b0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
          }
          if (cVar6._M_node != local_218) goto LAB_0022297c;
          if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            iVar4 = 0x9f2;
            goto LAB_00222b55;
          }
          if (*(uint *)&p_Var12[0x17]._M_left < 4) {
            args = &switchD_0022196e::switchdataD_003dcfd0;
            switch(*(uint *)&p_Var12[0x17]._M_left) {
            default:
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        (&local_1c0->materialBinding,(Relationship *)&p_Var12[0x17]._M_left);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1
                        );
              goto LAB_002216b9;
            case 2:
              if ((long)p_Var12[0x1e]._M_left - (long)p_Var12[0x1e]._M_parent != 0xd0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                iVar4 = 0x9f2;
                goto LAB_00223447;
              }
            case 1:
              this = local_1c0;
            }
            goto LAB_00221e1e;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_270._0_8_ = local_270 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_270,
                     "Internal error. Property `{}` is not a valid Relationship.","");
          fmt::format<char_const*>
                    ((string *)&local_250,(fmt *)local_270,(string *)&kMaterialBindingPreview,
                     (char **)args);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(char *)local_250._M_allocated_capacity,
                               local_250._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_allocated_capacity != &local_240) {
            operator_delete((void *)local_250._M_allocated_capacity,
                            local_240._M_allocated_capacity + 1);
          }
          psVar2 = local_230;
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
          }
          if (psVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          goto LAB_00222cab;
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_250,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_270,psVar2);
          ::std::__cxx11::string::operator=((string *)psVar2,(string *)local_250._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_allocated_capacity != &local_240) goto LAB_00222c87;
          goto LAB_00222c94;
        }
LAB_002216b9:
        iVar4 = ::std::__cxx11::string::compare((char *)p_Var1);
        if (iVar4 == 0) {
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_228,(key_type *)p_Var1);
          if (cVar6._M_node != local_218) goto LAB_0022297c;
          if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            iVar4 = 0x9fb;
            goto LAB_002230fe;
          }
          local_1b0._0_8_ = local_1b0 + 0x10;
          local_1b0._8_8_ = (_Base_ptr)0x0;
          local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
          ::std::__cxx11::string::_M_replace((ulong)local_1b0,0,(char *)0x0,0x3d13b4);
          local_250._M_allocated_capacity = (size_type)&local_240;
          local_250._8_8_ = 0;
          local_240._M_allocated_capacity = local_240._M_allocated_capacity & 0xffffffffffffff00;
          args = (uint *)0x3d13b4;
          ::std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)0x0,0x3d13b4);
          pmVar11 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                    ::operator[](local_38,(key_type *)local_1b0);
          ordered_dict<tinyusdz::Relationship>::insert
                    (pmVar11,(string *)&local_250,(Relationship *)&p_Var12[0x17]._M_left);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_allocated_capacity != &local_240) {
            operator_delete((void *)local_250._M_allocated_capacity,
                            local_240._M_allocated_capacity + 1);
          }
          p_Var18 = local_220;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
            p_Var18 = local_220;
          }
LAB_00221e23:
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
        }
        else {
          local_250._M_allocated_capacity = (size_type)&local_240;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,":","");
          plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x3df4a3)
          ;
          local_1b0._0_8_ = local_1b0 + 0x10;
          args = (uint *)(plVar5 + 2);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args) {
            local_1b0._16_8_ =
                 (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                 _M_dataplus)._M_p;
            local_1b0._24_8_ = plVar5[3];
          }
          else {
            local_1b0._16_8_ =
                 (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                 _M_dataplus)._M_p;
            local_1b0._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
          }
          uVar3 = local_1b0._0_8_;
          local_1b0._8_8_ = plVar5[1];
          *plVar5 = (long)args;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (p_Var12[1]._M_parent < (ulong)local_1b0._8_8_) {
            bVar19 = false;
          }
          else if ((_Base_ptr)local_1b0._8_8_ == (_Base_ptr)0x0) {
            bVar19 = true;
          }
          else {
            iVar4 = bcmp((void *)local_1b0._0_8_,*(void **)p_Var1,local_1b0._8_8_);
            bVar19 = iVar4 == 0;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1b0 + 0x10)) {
            operator_delete((void *)uVar3,(ulong)(local_1b0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_allocated_capacity != &local_240) {
            operator_delete((void *)local_250._M_allocated_capacity,
                            local_240._M_allocated_capacity + 1);
          }
          if (bVar19) {
            cVar6 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(local_228,(key_type *)p_Var1);
            p_Var18 = local_220;
            if (cVar6._M_node != local_218) goto LAB_0022297c;
            if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              local_270._0_8_ = local_270 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,":","");
              puVar7 = (undefined8 *)
                       ::std::__cxx11::string::replace((ulong)local_270,0,(char *)0x0,0x3df4a3);
              local_1b0._0_8_ = local_1b0 + 0x10;
              args = (uint *)(puVar7 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args) {
                local_1b0._16_8_ =
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                     _M_dataplus)._M_p;
                local_1b0._24_8_ = puVar7[3];
              }
              else {
                local_1b0._16_8_ =
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                     _M_dataplus)._M_p;
                local_1b0._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
              }
              local_1b0._8_8_ = puVar7[1];
              *puVar7 = args;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              p_Var18 = p_Var12[1]._M_parent;
              if (p_Var18 < (ulong)local_1b0._8_8_) {
                pvVar17 = *(void **)p_Var1;
LAB_00221e8b:
                local_250._M_allocated_capacity = (size_type)&local_240;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_250,pvVar17,(long)&p_Var18->_M_color + (long)pvVar17);
              }
              else {
                if ((_Base_ptr)local_1b0._8_8_ != (_Base_ptr)0x0) {
                  pvVar17 = *(void **)p_Var1;
                  iVar4 = bcmp((void *)local_1b0._0_8_,pvVar17,local_1b0._8_8_);
                  if (iVar4 != 0) goto LAB_00221e8b;
                }
                args = (uint *)0xffffffffffffffff;
                ::std::__cxx11::string::substr((ulong)&local_250,(ulong)p_Var1);
              }
              p_Var18 = local_220;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1b0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_1b0 + 0x10)) {
                operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_270._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_270 + 0x10)) {
                operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
              }
              if (local_250._8_8_ == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0xa12);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "empty NAME is not allowed for \'mateirial:binding:collection\'",0x3c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
                if (local_230 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar7 = (undefined8 *)
                           ::std::__cxx11::string::_M_append
                                     ((char *)&local_208,(ulong)(local_230->_M_dataplus)._M_p);
                  args = (uint *)(puVar7 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7
                      == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)
                  {
                    local_270._16_8_ =
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          )->_M_dataplus)._M_p;
                    local_270._24_8_ = puVar7[3];
                    local_270._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_270 + 0x10);
                  }
                  else {
                    local_270._16_8_ =
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          )->_M_dataplus)._M_p;
                    local_270._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *puVar7;
                  }
                  local_270._8_8_ = puVar7[1];
                  *puVar7 = args;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_230,(string *)local_270);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_270._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_270 + 0x10)) goto LAB_002228fb;
                  goto LAB_00222908;
                }
                goto LAB_0022292a;
              }
              local_270._0_8_ = local_270 + 0x10;
              local_1c8 = p_Var1;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,":","");
              local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar16 = 0x147ae15;
              uVar9 = 0;
              do {
                args = (uint *)local_270._8_8_;
                uVar8 = ::std::__cxx11::string::find_first_not_of
                                  (local_250._M_local_buf,local_270._0_8_,uVar9);
                if (uVar8 == 0xffffffffffffffff) break;
                uVar9 = ::std::__cxx11::string::find(local_250._M_local_buf,local_270._0_8_,uVar8);
                args = (uint *)(uVar9 - uVar8);
                ::std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_250);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1b0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1b0 + 0x10)) {
                  operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                }
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_270._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_270 + 0x10)) {
                operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
              }
              p_Var18 = local_220;
              if ((ulong)((long)local_1e8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1e8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
                args = (uint *)(local_1b0 + 0x10);
                local_1b0._8_8_ = (_Base_ptr)0x0;
                local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
                local_1b0._0_8_ = args;
                if ((long)local_1e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                  local_270._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_270._16_8_ = local_270._16_8_ & 0xffffffffffffff00;
                  local_270._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_270 + 0x10);
                  ::std::__cxx11::string::_M_assign((string *)local_270);
                  ::std::__cxx11::string::operator=((string *)local_1b0,(string *)local_270);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_270._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_270 + 0x10)) {
                    operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                  }
                }
                ::std::__cxx11::string::_M_assign((string *)local_250._M_local_buf);
                local_270._8_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_270._16_8_ = local_270._16_8_ & 0xffffffffffffff00;
                local_270._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_270 + 0x10);
                ::std::__cxx11::string::_M_assign((string *)local_270);
                pmVar11 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                          ::operator[](local_38,(key_type *)local_270);
                ordered_dict<tinyusdz::Relationship>::insert
                          (pmVar11,(string *)local_1b0,(Relationship *)&p_Var12[0x17]._M_left);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_270._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_228,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1b0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1b0 + 0x10)) goto LAB_00222336;
                goto LAB_00222346;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0xa16);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,
                         "3 or more namespaces is not allowed for \'mateirial:binding:collection\'",
                         0x46);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
LAB_0022268a:
              if (local_230 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                psVar2 = local_230;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_270,&local_208,local_230);
                ::std::__cxx11::string::operator=((string *)psVar2,(string *)local_270);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_270._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != &local_208.field_2) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
              ::std::ios_base::~ios_base(local_140);
              iVar4 = 1;
LAB_0022272e:
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1e8);
              goto LAB_00222950;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            iVar4 = 0xa0d;
LAB_002230fe:
            poVar10 = (ostream *)::std::ostream::operator<<((ostream *)local_1b0,iVar4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_270._0_8_ = local_270 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_270,"`{}` must be a Relationship","");
            fmt::format<std::__cxx11::string>
                      ((string *)&local_250,(fmt *)local_270,(string *)p_Var1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,(char *)local_250._M_allocated_capacity,
                                 local_250._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_allocated_capacity != &local_240) {
              operator_delete((void *)local_250._M_allocated_capacity,
                              local_240._M_allocated_capacity + 1);
            }
            psVar2 = local_230;
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
            }
            if (psVar2 == (string *)0x0) goto LAB_00222cab;
            ::std::__cxx11::stringbuf::str();
            plVar5 = (long *)::std::__cxx11::string::_M_append
                                       (local_270,(ulong)(psVar2->_M_dataplus)._M_p);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar13) {
              local_240._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_240._8_8_ = plVar5[3];
              local_250._M_allocated_capacity = (size_type)&local_240;
            }
            else {
              local_240._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_250._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar5;
            }
            local_250._8_8_ = plVar5[1];
            *plVar5 = (long)paVar13;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar2,(string *)local_250._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_allocated_capacity != &local_240) {
              operator_delete((void *)local_250._M_allocated_capacity,
                              local_240._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_270._0_8_ == local_270 + 0x10) goto LAB_00222cab;
            goto LAB_00222c9e;
          }
          local_250._M_allocated_capacity = (size_type)&local_240;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,":","");
          puVar7 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x3df454);
          local_1b0._0_8_ = local_1b0 + 0x10;
          args = (uint *)(puVar7 + 2);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args) {
            local_1b0._16_8_ =
                 (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                 _M_dataplus)._M_p;
            local_1b0._24_8_ = puVar7[3];
          }
          else {
            local_1b0._16_8_ =
                 (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                 _M_dataplus)._M_p;
            local_1b0._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
          }
          uVar3 = local_1b0._0_8_;
          local_1b0._8_8_ = puVar7[1];
          *puVar7 = args;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          if (p_Var12[1]._M_parent < (ulong)local_1b0._8_8_) {
            bVar19 = false;
          }
          else if ((_Base_ptr)local_1b0._8_8_ == (_Base_ptr)0x0) {
            bVar19 = true;
          }
          else {
            iVar4 = bcmp((void *)local_1b0._0_8_,*(void **)p_Var1,local_1b0._8_8_);
            bVar19 = iVar4 == 0;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1b0 + 0x10)) {
            operator_delete((void *)uVar3,(ulong)(local_1b0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_allocated_capacity != &local_240) {
            operator_delete((void *)local_250._M_allocated_capacity,
                            local_240._M_allocated_capacity + 1);
          }
          p_Var18 = local_220;
          if ((bVar19) &&
             (cVar6 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(local_228,(key_type *)p_Var1), cVar6._M_node == local_218)) {
            if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
              iVar4 = 0xa2f;
              goto LAB_002230fe;
            }
            local_270._0_8_ = local_270 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,":","");
            puVar7 = (undefined8 *)
                     ::std::__cxx11::string::replace((ulong)local_270,0,(char *)0x0,0x3df454);
            local_1b0._0_8_ = local_1b0 + 0x10;
            args = (uint *)(puVar7 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args) {
              local_1b0._16_8_ =
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                   _M_dataplus)._M_p;
              local_1b0._24_8_ = puVar7[3];
            }
            else {
              local_1b0._16_8_ =
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                   _M_dataplus)._M_p;
              local_1b0._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
            }
            local_1b0._8_8_ = puVar7[1];
            *puVar7 = args;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            p_Var18 = p_Var12[1]._M_parent;
            if (p_Var18 < (ulong)local_1b0._8_8_) {
              pvVar17 = *(void **)p_Var1;
LAB_002223a6:
              local_250._M_allocated_capacity = (size_type)&local_240;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_250,pvVar17,(long)&p_Var18->_M_color + (long)pvVar17);
            }
            else {
              if ((_Base_ptr)local_1b0._8_8_ != (_Base_ptr)0x0) {
                pvVar17 = *(void **)p_Var1;
                iVar4 = bcmp((void *)local_1b0._0_8_,pvVar17,local_1b0._8_8_);
                if (iVar4 != 0) goto LAB_002223a6;
              }
              args = (uint *)0xffffffffffffffff;
              ::std::__cxx11::string::substr((ulong)&local_250,(ulong)p_Var1);
            }
            p_Var18 = local_220;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_270 + 0x10)) {
              operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
            }
            if (local_250._8_8_ != 0) {
              local_270._0_8_ = local_270 + 0x10;
              local_1c8 = p_Var1;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,":","");
              local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar16 = 0x147ae15;
              uVar9 = 0;
              do {
                args = (uint *)local_270._8_8_;
                uVar8 = ::std::__cxx11::string::find_first_not_of
                                  (local_250._M_local_buf,local_270._0_8_,uVar9);
                if (uVar8 == 0xffffffffffffffff) break;
                uVar9 = ::std::__cxx11::string::find(local_250._M_local_buf,local_270._0_8_,uVar8);
                args = (uint *)(uVar9 - uVar8);
                ::std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_250);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1b0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1b0 + 0x10)) {
                  operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                }
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_270._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_270 + 0x10)) {
                operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
              }
              p_Var1 = local_1c8;
              p_Var18 = local_220;
              if (0x20 < (ulong)((long)local_1e8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1e8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0xa38);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_208,
                           "PURPOSE `{}` must not have nested namespaces for \'mateirial:binding\'",
                           "");
                fmt::format<std::__cxx11::string>
                          ((string *)local_270,(fmt *)&local_208,(string *)&local_250,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,(char *)local_270._0_8_,local_270._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_270._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != &local_208.field_2) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
                goto LAB_0022268a;
              }
              local_1b0._8_8_ = (_Base_ptr)0x0;
              local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
              local_1b0._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b0 + 0x10);
              ::std::__cxx11::string::_M_assign((string *)local_1b0);
              MaterialBinding::set_materialBinding
                        (local_210,(Relationship *)&p_Var12[0x17]._M_left,(token *)local_1b0);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1
                        );
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1b0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_1b0 + 0x10)) {
LAB_00222336:
                operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
              }
LAB_00222346:
              iVar4 = 3;
              goto LAB_0022272e;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0xa34);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "empty PURPOSE is not allowed for \'mateirial:binding:\'",0x35);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
            if (local_230 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              psVar2 = local_230;
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_270,&local_208,local_230);
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)local_270);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_270._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_270 + 0x10)) {
LAB_002228fb:
                operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
              }
LAB_00222908:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
            }
LAB_0022292a:
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            ::std::ios_base::~ios_base(local_140);
            iVar4 = 1;
LAB_00222950:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_allocated_capacity != &local_240) {
              operator_delete((void *)local_250._M_allocated_capacity,
                              local_240._M_allocated_capacity + 1);
            }
            if (iVar4 == 3) goto LAB_0022297c;
            goto LAB_00222ccc;
          }
        }
LAB_0022297c:
        p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
      } while (p_Var12 != p_Var18);
      bVar19 = true;
    }
  }
  return bVar19;
}

Assistant:

bool ReconstructMaterialBindingProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  MaterialBinding *mb, /* inout */
  std::string *err)
{

  if (!mb) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBinding, mb->materialBinding)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingPreview)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingFull)
    // material:binding:collection
    if (prop.first == kMaterialBindingCollection) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(""), value::token(""), rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:collection[:PURPOSE]:NAME
    if (startsWith(prop.first, kMaterialBindingCollection + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string collection_name = removePrefix(prop.first, kMaterialBindingCollection + std::string(":"));
      if (collection_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty NAME is not allowed for 'mateirial:binding:collection'");
      }
      std::vector<std::string> names = split(collection_name, ":");
      if (names.size() > 2) {
        PUSH_ERROR_AND_RETURN("3 or more namespaces is not allowed for 'mateirial:binding:collection'");
      }
      value::token mat_purpose; // empty = all-purpose
      if (names.size() == 1) {
        collection_name = names[0];
      } else {
        mat_purpose = value::token(names[0]);
        collection_name = names[1];
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(collection_name), mat_purpose, rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:PURPOSE
    if (startsWith(prop.first, kMaterialBinding + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string purpose_name = removePrefix(prop.first, kMaterialBinding + std::string(":"));
      if (purpose_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty PURPOSE is not allowed for 'mateirial:binding:'");
      }
      std::vector<std::string> names = split(purpose_name, ":");
      if (names.size() > 1) {
        PUSH_ERROR_AND_RETURN(fmt::format("PURPOSE `{}` must not have nested namespaces for 'mateirial:binding'", purpose_name));
      }
      value::token mat_purpose = value::token(names[0]);

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBinding(rel, mat_purpose);

      table.insert(prop.first);
      continue;
    }
  }

  return true;
}